

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_45568::CtfSeeker::update(CtfSeeker *this,float currentTime,float elapsedTime)

{
  long *plVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  bool bVar5;
  undefined7 extraout_var;
  undefined1 *color;
  long lVar6;
  uint uVar7;
  float fVar8;
  undefined8 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined8 uVar10;
  uint extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  uint extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  Vec3 VVar17;
  Vec3 local_148;
  Vec3 local_138;
  float local_12c;
  undefined1 local_128 [8];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Vec3 local_110;
  Vec3 local_100;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [12];
  float fStack_dc;
  uint local_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  Vec3 local_98;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  float local_78;
  undefined4 uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Vec3 local_40;
  
  local_12c = elapsedTime;
  local_f0 = currentTime;
  if (this->state == running) {
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    fVar14 = (float)uVar9 - (anonymous_namespace)::gHomeBaseCenter;
    fVar8 = (float)((ulong)uVar9 >> 0x20) - DAT_0017d0f4;
    elapsedTime = (elapsedTime - DAT_0017d0f8) * (elapsedTime - DAT_0017d0f8) +
                  fVar14 * fVar14 + fVar8 * fVar8;
    if (elapsedTime < 0.0) {
      fVar8 = sqrtf(elapsedTime);
    }
    else {
      fVar8 = SQRT(elapsedTime);
    }
    fVar14 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                       super_SimpleVehicle_3.
                                       super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                       .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                       super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this)
    ;
    if (fVar8 < fVar14 + 1.5) {
      this->state = atGoal;
    }
  }
  if (this->state == running) {
    this->lastRunningTime = local_f0;
  }
  else {
    elapsedTime = local_f0;
    if (this->lastRunningTime + 4.0 < local_f0) {
      OpenSteer::OpenSteerDemo::queueDelayedResetPlugInXXX();
    }
  }
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_98.z = 0.0;
  if (this->state == running) {
    local_b8 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
    uStack_74 = (undefined4)((ulong)uVar9 >> 0x20);
    local_78 = (float)uVar9 + (float)uVar9;
    uStack_70 = extraout_XMM0_Dc;
    uStack_6c = extraout_XMM0_Dd;
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    local_110.z = DAT_0017d0f8 - elapsedTime;
    auVar16._0_4_ = (anonymous_namespace)::gHomeBaseCenter - (float)uVar9;
    auVar16._4_4_ = DAT_0017d0f4 - (float)((ulong)uVar9 >> 0x20);
    auVar16._8_4_ = 0.0 - extraout_XMM0_Dc_00;
    auVar16._12_4_ = 0.0 - extraout_XMM0_Dd_00;
    local_58 = local_110.z * local_110.z +
               auVar16._0_4_ * auVar16._0_4_ + auVar16._4_4_ * auVar16._4_4_;
    if (local_58 < 0.0) {
      _local_128 = auVar16;
      local_58 = sqrtf(local_58);
      uStack_54 = extraout_XMM0_Db;
      uStack_50 = extraout_XMM0_Dc_01;
      uStack_4c = extraout_XMM0_Dd_01;
      auVar16 = _local_128;
      uVar9 = local_b8;
    }
    else {
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_58 = SQRT(local_58);
      uVar9 = local_b8;
    }
    local_b8._4_4_ = (float)((ulong)uVar9 >> 0x20);
    local_b8._0_4_ = (float)uVar9;
    local_b8._0_4_ = (float)local_b8 * 8.0;
    auVar3._4_4_ = local_58;
    auVar3._0_4_ = local_58;
    auVar3._8_4_ = uStack_54;
    auVar3._12_4_ = uStack_54;
    auVar16 = divps(auVar16,auVar3);
    local_110.z = local_110.z / local_58;
    local_110._0_8_ = auVar16._0_8_;
    bVar5 = OpenSteer::
            SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
            ::isAside((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                       *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,0.5);
    uVar9 = CONCAT44(local_88._4_4_,(float)local_88);
    local_68 = (float)CONCAT31(local_68._1_3_,bVar5);
    local_c8 = (undefined1  [8])(CONCAT44(uStack_74,local_78) ^ 0x8000000080000000);
    fStack_c0 = (float)(uStack_70 ^ 0x80000000);
    fStack_bc = (float)(uStack_6c ^ 0x80000000);
    fVar8 = local_78 * -2.0;
    local_cc = (uint)CONCAT71(extraout_var,1);
    lVar6 = 0;
    local_ec = fVar8;
    do {
      plVar1 = *(long **)((long)&(anonymous_namespace)::ctfEnemies + lVar6);
      local_88 = uVar9;
      local_128 = (undefined1  [8])
                  (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3
                                     .
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                     super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      uStack_120 = extraout_XMM0_Dc_02;
      uStack_11c = extraout_XMM0_Dd_02;
      fVar14 = fVar8;
      uVar9 = (**(code **)(*plVar1 + 0x40))(plVar1);
      fVar12 = (float)local_128._0_4_ - (float)uVar9;
      fVar13 = (float)local_128._4_4_ - (float)((ulong)uVar9 >> 0x20);
      fVar8 = (fVar8 - fVar14) * (fVar8 - fVar14) + fVar12 * fVar12 + fVar13 * fVar13;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar14 = (float)(**(code **)(*plVar1 + 0xd8))(plVar1);
      fVar14 = (fVar8 * 0.3) / fVar14;
      local_138._0_8_ = (**(code **)(*plVar1 + 0xe8))(fVar14,plVar1);
      local_138.z = fVar14;
      uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      fVar8 = local_138.x - (float)uVar9;
      fVar12 = local_138.y - (float)((ulong)uVar9 >> 0x20);
      fVar14 = local_138.z - fVar14;
      local_e8._0_4_ = fVar12;
      local_128._0_4_ = fVar8;
      fVar8 = local_110.x * fVar8 + local_110.y * fVar12;
      fVar12 = local_110.z * fVar14 + fVar8;
      uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
      local_a8._0_4_ = fVar8;
      local_88 = uVar9;
      fVar13 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationCircleOrDisk
                ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 fVar13,&OpenSteer::Vec3::zero,&local_138,
                 (Color *)(anonymous_namespace)::clearPathColor,0x14,false,false);
      uVar9 = local_88;
      if (((float)local_c8._0_4_ < fVar12) && (fVar12 < local_58)) {
        fVar13 = (float)local_128._0_4_ - local_110.x * fVar12;
        fVar15 = (float)local_e8._0_4_ - local_110.y * fVar12;
        fVar8 = fVar14 - fVar12 * local_110.z;
        fVar12 = fVar8 * fVar8 + fVar13 * fVar13 + fVar15 * fVar15;
        if (fVar12 < 0.0) {
          fVar12 = sqrtf(fVar12);
          uVar9 = local_88;
        }
        else {
          fVar12 = SQRT(fVar12);
        }
        local_88._4_4_ = (float)((ulong)uVar9 >> 0x20);
        local_88._0_4_ = (float)uVar9;
        fVar8 = (float)local_b8;
        if (fVar12 < (float)local_b8) {
          local_a8._0_4_ =
               (float)local_a8 * fVar14 +
               (float)local_128._0_4_ * (float)local_88 + (float)local_e8._0_4_ * local_88._4_4_;
          local_88 = uVar9;
          fVar14 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
          fVar8 = local_ec;
          uVar9 = local_88;
          if ((local_ec <= fVar14 + (float)local_a8) &&
             ((fVar14 + (float)local_a8 < (float)local_c8._0_4_ & local_68._0_1_) == 0)) {
            local_100._0_8_ =
                 (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                    .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                    super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
            local_100.z = fVar8;
            local_40._0_8_ = (**(code **)(*plVar1 + 0x40))(plVar1);
            local_40.z = fVar8;
            OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
            annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                            *)this,&local_100,&local_40,
                           (Color *)(anonymous_namespace)::clearPathColor);
            local_cc = 0;
            uVar9 = local_88;
          }
        }
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x20);
    local_88 = uVar9;
    local_a8 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x10))(this);
    fVar8 = fVar8 * (float)local_b8;
    local_c8._0_4_ = fVar8;
    local_e8._0_8_ =
         (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                            super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                            .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle
                            .super_AbstractLocalSpace + 0x30))(this);
    local_128._0_4_ = fVar8;
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    fVar8 = fVar8 - (float)local_128._0_4_ * local_78;
    local_128._0_4_ = fVar8;
    uVar10 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0xa0))
                       (this,&local_110);
    fVar14 = DAT_0017d0f8;
    local_ec = fVar8 * (float)local_b8;
    fVar8 = (float)uVar9 - local_78 * (float)local_e8._0_4_;
    fVar12 = (float)((ulong)uVar9 >> 0x20) - local_78 * (float)local_e8._4_4_;
    local_b8._4_4_ = (float)local_b8;
    fStack_b0 = (float)local_b8;
    fStack_ac = (float)local_b8;
    local_68 = (float)uVar10 * (float)local_b8;
    fStack_64 = (float)((ulong)uVar10 >> 0x20) * (float)local_b8;
    fStack_60 = extraout_XMM0_Dc_03 * (float)local_b8;
    fStack_5c = extraout_XMM0_Dd_03 * (float)local_b8;
    local_138.x = fVar8 + local_68;
    local_138.y = fVar12 + fStack_64;
    local_138.z = (float)local_128._0_4_ + local_ec;
    local_e8._0_4_ = (anonymous_namespace)::gHomeBaseCenter;
    local_e8._4_4_ = DAT_0017d0f4;
    stack0xffffffffffffff20 = 0;
    local_88._0_4_ = (anonymous_namespace)::gHomeBaseCenter + local_68;
    local_88._4_4_ = DAT_0017d0f4 + fStack_64;
    fStack_80 = fStack_60 + 0.0;
    fStack_7c = fStack_5c + 0.0;
    local_100.z = local_ec + DAT_0017d0f8;
    local_100.y = local_88._4_4_;
    local_100.x = (float)local_88;
    local_58 = local_100.z;
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                   &local_138,&local_100,(Color *)(anonymous_namespace)::clearPathColor);
    local_138.z = (float)local_128._0_4_ - local_ec;
    local_138.y = fVar12 - fStack_64;
    local_138.x = fVar8 - local_68;
    local_e8._0_4_ = (float)local_e8._0_4_ - local_68;
    local_e8._4_4_ = (float)local_e8._4_4_ - fStack_64;
    stack0xffffffffffffff20 = CONCAT44(fStack_dc - fStack_5c,(float)local_e8._8_4_ - fStack_60);
    fVar14 = fVar14 - local_ec;
    local_100.y = (float)local_e8._4_4_;
    local_100.x = (float)local_e8._0_4_;
    local_100.z = fVar14;
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                   &local_138,&local_100,(Color *)(anonymous_namespace)::clearPathColor);
    local_138.x = (float)local_e8._0_4_;
    local_138.y = (float)local_e8._4_4_;
    local_100.y = local_88._4_4_;
    local_100.x = (float)local_88;
    local_100.z = local_58;
    local_138.z = fVar14;
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                   &local_138,&local_100,(Color *)(anonymous_namespace)::clearPathColor);
    fVar14 = (float)local_128._0_4_ - (float)local_c8._0_4_;
    local_138.y = fVar12 - local_b8._4_4_ * local_a8._4_4_;
    local_138.x = fVar8 - (float)local_b8 * (float)local_a8;
    local_100.x = (float)local_b8 * (float)local_a8 + fVar8;
    local_100.y = local_b8._4_4_ * local_a8._4_4_ + fVar12;
    local_100.z = (float)local_128._0_4_ + (float)local_c8._0_4_;
    local_138.z = fVar14;
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                   &local_138,&local_100,(Color *)(anonymous_namespace)::clearPathColor);
    uVar4 = local_cc;
    if ((local_cc & 1) == 0) {
      this->evading = true;
      fVar8 = 0.9;
    }
    else {
      this->evading = false;
      uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      fVar8 = (anonymous_namespace)::gHomeBaseCenter - (float)uVar9;
      fVar12 = DAT_0017d0f4 - (float)((ulong)uVar9 >> 0x20);
      fVar14 = (DAT_0017d0f8 - fVar14) * (DAT_0017d0f8 - fVar14) + fVar8 * fVar8 + fVar12 * fVar12;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      bVar5 = OpenSteer::
              SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
              ::isAhead((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                         *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,0.98);
      fVar12 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                         super_SimpleVehicle_3.
                                         super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                         .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                         super_AbstractVehicle.super_AbstractLocalSpace + 0xd8))
                                (this);
      fVar8 = 0.9;
      if (bVar5) {
        uVar7 = -(uint)(2.0 <= fVar14 / fVar12);
        fVar8 = (float)(~uVar7 & 0x3f666666 | uVar7 & 0x40000000);
      }
    }
    VVar17 = OpenSteer::
             SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
             ::steerToAvoidObstacles
                       ((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                         *)this,fVar8,(ObstacleGroup *)&(anonymous_namespace)::CtfBase::allObstacles
                       );
    fVar8 = VVar17.z;
    uVar9 = VVar17._0_8_;
    if ((((VVar17.x != OpenSteer::Vec3::zero.x) || (NAN(VVar17.x) || NAN(OpenSteer::Vec3::zero.x)))
        || (VVar17.y != OpenSteer::Vec3::zero.y)) || (NAN(VVar17.y) || NAN(OpenSteer::Vec3::zero.y))
       ) {
      (this->super_CtfBase).avoiding = true;
    }
    else {
      bVar5 = NAN(OpenSteer::Vec3::zero.z);
      bVar2 = fVar8 == OpenSteer::Vec3::zero.z;
      (this->super_CtfBase).avoiding = fVar8 != OpenSteer::Vec3::zero.z;
      if ((bVar2) && (!NAN(fVar8) && !bVar5)) {
        VVar17 = OpenSteer::
                 SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                 ::xxxsteerForSeek((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                    *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter);
        fVar8 = VVar17.z;
        local_100._0_8_ = VVar17._0_8_;
        local_100.z = fVar8;
        if ((uVar4 & 1) == 0) {
          fVar8 = 0.0;
          local_e8._4_4_ = 0.0;
          fVar14 = 0.0;
          fStack_dc = 0.0;
          lVar6 = 0;
          fVar12 = 0.0;
          do {
            local_e8._0_4_ = fVar8;
            stack0xffffffffffffff20 = CONCAT44(fStack_dc,fVar14);
            plVar1 = *(long **)((long)&(anonymous_namespace)::ctfEnemies + lVar6);
            uVar9 = (**(code **)(*plVar1 + 0x40))(plVar1);
            local_128._0_4_ = fVar8;
            uVar10 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                        super_SimpleVehicle_3.
                                        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                        .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                        super_AbstractVehicle.super_AbstractLocalSpace + 0x40))
                               (this);
            fVar14 = (float)uVar9 - (float)uVar10;
            fVar13 = (float)((ulong)uVar9 >> 0x20) - (float)((ulong)uVar10 >> 0x20);
            local_128._0_4_ = (float)local_128._0_4_ - fVar8;
            fVar8 = (float)local_128._0_4_ * (float)local_128._0_4_ +
                    fVar14 * fVar14 + fVar13 * fVar13;
            if (fVar8 < 0.0) {
              fVar8 = sqrtf(fVar8);
            }
            else {
              fVar8 = SQRT(fVar8);
            }
            local_c8._0_4_ = fVar8 * 0.5;
            local_a8._0_4_ = fVar8;
            fVar8 = (float)(**(code **)(*plVar1 + 0xd8))(plVar1);
            fVar8 = (float)local_c8._0_4_ / fVar8;
            local_138._0_8_ = (**(code **)(*plVar1 + 0xe8))(fVar8,plVar1);
            local_138.z = fVar8;
            fVar8 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
            OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
            annotationCircleOrDisk
                      ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                       this,fVar8,&OpenSteer::Vec3::zero,&local_138,
                       (Color *)(anonymous_namespace)::evadeColor,0x14,false,false);
            VVar17 = OpenSteer::
                     SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                     ::xxxsteerForFlee((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                        *)this,&local_138);
            fVar11 = VVar17.z;
            fStack_c0 = (float)extraout_XMM0_Dc_04;
            local_c8 = (undefined1  [8])VVar17._0_8_;
            fStack_bc = (float)extraout_XMM0_Dd_04;
            local_88._0_4_ = fVar11;
            uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                       super_SimpleVehicle_3.
                                       super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                       .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                       super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this)
            ;
            fVar11 = fVar11 * (float)local_128._0_4_;
            fVar8 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                              super_SimpleVehicle_3.
                                              super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                              .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                              super_AbstractVehicle.super_AbstractLocalSpace + 0xc0)
                           )(this);
            fVar15 = 4.0 / (float)local_a8;
            fVar13 = *(float *)(&DAT_00149d20 +
                               (ulong)(fVar8 * -2.0 <
                                      fVar11 + fVar14 * (float)uVar9 +
                                               fVar13 * (float)((ulong)uVar9 >> 0x20)) * 4);
            fVar12 = fVar12 + (float)local_88 * fVar15 * fVar13;
            fVar8 = (float)local_e8._0_4_ + fVar13 * fVar15 * (float)local_c8._0_4_;
            local_e8._4_4_ = (float)local_e8._4_4_ + fVar13 * fVar15 * (float)local_c8._4_4_;
            fVar14 = (float)local_e8._8_4_ + fVar13 * fVar15 * fStack_c0;
            fStack_dc = fStack_dc + fVar13 * fVar15 * fStack_bc;
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x20);
          local_e8._0_4_ = fVar8;
          stack0xffffffffffffff20 = CONCAT44(fStack_dc,fVar14);
          fVar14 = local_100.z + fVar12;
          local_138.y = local_100.y + (float)local_e8._4_4_;
          local_138.x = local_100.x + fVar8;
          local_138.z = fVar14;
          local_110._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
          local_110.z = fVar14;
          VVar17 = OpenSteer::vecLimitDeviationAngleUtility(true,&local_138,0.707,&local_110);
          fVar8 = VVar17.z;
          local_128._0_4_ = fVar8;
          local_138._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_138.z = fVar8;
          uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3
                                     .
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                     super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_110.x = local_100.x + (float)uVar9;
          local_110.y = local_100.y + (float)((ulong)uVar9 >> 0x20);
          fVar8 = fVar8 + local_100.z;
          local_110.z = fVar8;
          OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
          annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *
                         )this,&local_138,&local_110,(Color *)OpenSteer::gRed);
          local_138._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_138.z = fVar8;
          uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3
                                     .
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                     super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          fVar8 = fVar8 + fVar12;
          local_110.y = (float)((ulong)uVar9 >> 0x20) + (float)local_e8._4_4_;
          local_110.x = (float)uVar9 + (float)local_e8._0_4_;
          local_110.z = fVar8;
          OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
          annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *
                         )this,&local_138,&local_110,(Color *)OpenSteer::gGreen);
          local_138._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_138.z = fVar8;
          uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3
                                     .
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                     super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_148.x = VVar17.x;
          local_148.y = VVar17.y;
          local_110.x = local_148.x * 0.2 + (float)uVar9;
          local_110.y = local_148.y * 0.2 + (float)((ulong)uVar9 >> 0x20);
          local_110.z = (float)local_128._0_4_ * 0.2 + fVar8;
          color = (anonymous_namespace)::evadeColor;
          local_148._0_8_ = VVar17._0_8_;
        }
        else {
          local_138._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
          local_138.z = fVar8;
          VVar17 = OpenSteer::vecLimitDeviationAngleUtility(true,&local_100,0.707,&local_138);
          fVar8 = VVar17.z;
          local_128._0_4_ = fVar8;
          local_138._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_138.z = fVar8;
          uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3
                                     .
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                     super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_148.x = VVar17.x;
          local_148.y = VVar17.y;
          local_110.x = local_148.x * 0.2 + (float)uVar9;
          local_110.y = local_148.y * 0.2 + (float)((ulong)uVar9 >> 0x20);
          local_110.z = (float)local_128._0_4_ * 0.2 + fVar8;
          color = (anonymous_namespace)::seekColor;
          local_148._0_8_ = VVar17._0_8_;
        }
        OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
        annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                       this,&local_138,&local_110,(Color *)color);
        uVar9 = local_148._0_8_;
        fVar8 = (float)local_128._0_4_;
      }
    }
  }
  else {
    OpenSteer::SimpleVehicle::applyBrakingForce((SimpleVehicle *)this,0.75,local_12c);
    uVar9 = local_98._0_8_;
    fVar8 = local_98.z;
  }
  local_98.z = fVar8;
  local_98._0_8_ = uVar9;
  OpenSteer::SimpleVehicle::applySteeringForce((SimpleVehicle *)this,&local_98,local_12c);
  fVar8 = 3.0;
  OpenSteer::SimpleVehicle::annotationVelocityAcceleration((SimpleVehicle *)this,3.0,3.0);
  local_138._0_8_ =
       (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x40))(this);
  local_138.z = fVar8;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this
                    ,local_f0,&local_138);
  return;
}

Assistant:

void CtfSeeker::update (const float currentTime, const float elapsedTime)
    {
        // do behavioral state transitions, as needed
        updateState (currentTime);

        // determine and apply steering/braking forces
        Vec3 steer (0, 0, 0);
        if (state == running)
        {
            steer = steeringForSeeker ();
        }
        else
        {
            applyBrakingForce (gBrakingRate, elapsedTime);
        }
        applySteeringForce (steer, elapsedTime);

        // annotation
        annotationVelocityAcceleration ();
        recordTrailVertex (currentTime, position());
    }